

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::anon_unknown_5::TileBufferTask::execute(TileBufferTask *this)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  reference pvVar4;
  char *endPtr_00;
  char **in_RDI;
  exception *e;
  int compSize;
  char *compPtr;
  char *endPtr;
  char *readPtr;
  intptr_t base;
  int yOffset;
  int xOffset;
  TOutSliceInfo *slice;
  uint i;
  int y;
  int numPixelsPerScanLine;
  int numScanLines;
  Box2i tileRange;
  char *writePtr;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffef4;
  long *plVar7;
  Array<char> *tileBuffer;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar8;
  undefined8 in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  char **writePtr_00;
  TileDescription *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  PixelType in_stack_ffffffffffffff78;
  Format in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  undefined4 uStack_74;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  uint local_44;
  int local_40;
  int local_30;
  int local_28;
  
  ppcVar2 = (char **)Array::operator_cast_to_char_((Array *)in_RDI[3]);
  uVar5 = *(undefined4 *)(in_RDI[3] + 0x28);
  uVar6 = *(undefined4 *)(in_RDI[3] + 0x2c);
  writePtr_00 = ppcVar2;
  Imf_3_2::dataWindowForTile
            (in_stack_ffffffffffffff68,(int)((ulong)ppcVar2 >> 0x20),(int)ppcVar2,
             (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  for (local_40 = local_30; local_40 <= local_28; local_40 = local_40 + 1) {
    local_44 = 0;
    while( true ) {
      endPtr_00 = (char *)(ulong)local_44;
      pcVar3 = (char *)std::
                       vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                       ::size((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                               *)(in_RDI[2] + 0xe8));
      if (pcVar3 <= endPtr_00) break;
      pvVar4 = std::
               vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
               ::operator[]((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo>_>
                             *)(in_RDI[2] + 0xe8),(ulong)local_44);
      if ((pvVar4->zero & 1U) == 0) {
        copyFromFrameBuffer(writePtr_00,in_RDI,endPtr_00,in_stack_ffffffffffffff48,
                            (Format)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                            (PixelType)in_stack_ffffffffffffff40);
      }
      else {
        fillChannelWithZeroes
                  ((char **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      local_44 = local_44 + 1;
    }
  }
  pcVar3 = Array::operator_cast_to_char_((Array *)in_RDI[3]);
  *(int *)(in_RDI[3] + 0x18) = (int)ppcVar2 - (int)pcVar3;
  pcVar3 = Array::operator_cast_to_char_((Array *)in_RDI[3]);
  *(char **)(in_RDI[3] + 0x10) = pcVar3;
  if (*(long *)(in_RDI[3] + 0x20) != 0) {
    pcVar3 = in_RDI[3];
    plVar7 = *(long **)(pcVar3 + 0x20);
    tileBuffer = *(Array<char> **)(pcVar3 + 0x10);
    uVar8 = *(undefined4 *)(pcVar3 + 0x18);
    Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
              ((Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffef4,uVar6),
               (Box<Imath_3_2::Vec2<int>_> *)CONCAT44(in_stack_fffffffffffffeec,uVar5));
    iVar1 = (**(code **)(*plVar7 + 0x28))
                      (plVar7,tileBuffer,uVar8,&stack0xffffffffffffff74,&stack0xffffffffffffff88);
    if (iVar1 < *(int *)(in_RDI[3] + 0x18)) {
      *(int *)(in_RDI[3] + 0x18) = iVar1;
      *(ulong *)(in_RDI[3] + 0x10) = CONCAT44(uStack_74,in_stack_ffffffffffffff88);
    }
    else if (*(int *)(in_RDI[2] + 0xe0) == 0) {
      convertToXdr((Data *)CONCAT44(uVar8,in_stack_ffffffffffffff20),tileBuffer,
                   (int)((ulong)plVar7 >> 0x20),(int)plVar7);
    }
  }
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the frame buffer
        // into the tile buffer
        //
        // Convert one tile's worth of pixel data to
        // a machine-independent representation, and store
        // the result in _tileBuffer->buffer.
        //

        Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
            _ofd->tileDesc,
            _ofd->minX,
            _ofd->maxX,
            _ofd->minY,
            _ofd->maxY,
            _tileBuffer->tileCoord.dx,
            _tileBuffer->tileCoord.dy,
            _tileBuffer->tileCoord.lx,
            _tileBuffer->tileCoord.ly);

        int numScanLines = tileRange.max.y - tileRange.min.y + 1;
        //        int numPixelsPerScanLine = tileRange.max.x - tileRange.min.x + 1;

        //
        // Get the bytes for each line.
        //

        vector<uint64_t> bytesPerLine (_ofd->tileDesc.ySize);
        vector<int>      xOffsets (_ofd->slices.size ());
        vector<int>      yOffsets (_ofd->slices.size ());
        for (size_t i = 0; i < _ofd->slices.size (); i++)
        {
            const TOutSliceInfo& slice = *_ofd->slices[i];
            xOffsets[i]                = slice.xTileCoords * tileRange.min.x;
            yOffsets[i]                = slice.yTileCoords * tileRange.min.y;
        }

        calculateBytesPerLine (
            _ofd->header,
            _ofd->sampleCountSliceBase,
            _ofd->sampleCountXStride,
            _ofd->sampleCountYStride,
            tileRange.min.x,
            tileRange.max.x,
            tileRange.min.y,
            tileRange.max.y,
            xOffsets,
            yOffsets,
            bytesPerLine);

        //
        // Allocate the memory for internal buffer.
        // (TODO) more efficient memory management?
        //

        uint64_t totalBytes          = 0;
        uint64_t maxBytesPerTileLine = 0;
        for (size_t i = 0; i < bytesPerLine.size (); i++)
        {
            totalBytes += bytesPerLine[i];
            if (bytesPerLine[i] > maxBytesPerTileLine)
                maxBytesPerTileLine = bytesPerLine[i];
        }
        _tileBuffer->buffer.resizeErase (static_cast<long> (totalBytes));

        char* writePtr = _tileBuffer->buffer;

        //
        // Iterate over the scan lines in the tile.
        //

        int xOffsetForSampleCount =
            (_ofd->sampleCountXTileCoords == 0) ? 0 : tileRange.min.x;
        int yOffsetForSampleCount =
            (_ofd->sampleCountYTileCoords == 0) ? 0 : tileRange.min.y;

        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size (); ++i)
            {
                const TOutSliceInfo& slice = *_ofd->slices[i];

                //
                // Fill the tile buffer with pixel data.
                //

                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _data->tileBuffer.
                    //

                    fillChannelWithZeroes (
                        writePtr,
                        _ofd->format,
                        slice.type,
                        bytesPerLine[y - tileRange.min.y]);
                }
                else
                {
                    //
                    // The frame buffer contains data for this channel.
                    //

                    int xOffsetForData = slice.xTileCoords ? tileRange.min.x
                                                           : 0;
                    int yOffsetForData = slice.yTileCoords ? tileRange.min.y
                                                           : 0;

                    // (TODO) treat sample count offsets differently.
                    copyFromDeepFrameBuffer (
                        writePtr,
                        slice.base,
                        _ofd->sampleCountSliceBase,
                        _ofd->sampleCountXStride,
                        _ofd->sampleCountYStride,
                        y,
                        tileRange.min.x,
                        tileRange.max.x,
                        xOffsetForSampleCount,
                        yOffsetForSampleCount,
                        xOffsetForData,
                        yOffsetForData,
                        slice.sampleStride,
                        slice.xStride,
                        slice.yStride,
                        _ofd->format,
                        slice.type);
#if defined(DEBUG)
                    assert (writePtr - _tileBuffer->buffer <= totalBytes);
#endif
                }
            }
        }

        //
        // Compress the pixel sample count table.
        //

        char*    ptr           = _tileBuffer->sampleCountTableBuffer;
        uint64_t tableDataSize = 0;
        for (int i = tileRange.min.y; i <= tileRange.max.y; i++)
        {
            int count = 0;
            for (int j = tileRange.min.x; j <= tileRange.max.x; j++)
            {
                count += _ofd->getSampleCount (
                    j - xOffsetForSampleCount, i - yOffsetForSampleCount);
                Xdr::write<CharPtrIO> (ptr, count);
                tableDataSize += sizeof (int);
            }
        }

        if (_tileBuffer->sampleCountTableCompressor)
        {
            _tileBuffer->sampleCountTableSize =
                _tileBuffer->sampleCountTableCompressor->compress (
                    _tileBuffer->sampleCountTableBuffer,
                    static_cast<int> (tableDataSize),
                    tileRange.min.y,
                    _tileBuffer->sampleCountTablePtr);
        }

        //
        // If we can't make data shrink (or compression was disabled), then just use the raw data.
        //

        if (!_tileBuffer->sampleCountTableCompressor ||
            _tileBuffer->sampleCountTableSize >= _ofd->maxSampleCountTableSize)
        {
            _tileBuffer->sampleCountTableSize = _ofd->maxSampleCountTableSize;
            _tileBuffer->sampleCountTablePtr =
                _tileBuffer->sampleCountTableBuffer;
        }

        //
        // Compress the contents of the tileBuffer,
        // and store the compressed data in the output file.
        //

        _tileBuffer->dataSize         = writePtr - _tileBuffer->buffer;
        _tileBuffer->uncompressedSize = _tileBuffer->dataSize;
        _tileBuffer->dataPtr          = _tileBuffer->buffer;

        // (TODO) don't do this all the time.
        if (_tileBuffer->compressor != 0) delete _tileBuffer->compressor;
        _tileBuffer->compressor = newTileCompressor (
            _ofd->header.compression (),
            maxBytesPerTileLine,
            _ofd->tileDesc.ySize,
            _ofd->header);

        if (_tileBuffer->compressor)
        {
            const char* compPtr;

            uint64_t compSize = _tileBuffer->compressor->compressTile (
                _tileBuffer->dataPtr,
                static_cast<int> (_tileBuffer->dataSize),
                tileRange,
                compPtr);

            if (compSize < _tileBuffer->dataSize)
            {
                _tileBuffer->dataSize = compSize;
                _tileBuffer->dataPtr  = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using native format,
                // so we need to convert the lineBuffer to Xdr.
                //

                convertToXdr (
                    _ofd, _tileBuffer->buffer, numScanLines, bytesPerLine);
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception    = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}